

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_MD5.c
# Opt level: O2

void Hacl_Hash_MD5_update_last(uint32_t *s,uint64_t prev_len,uint8_t *input,uint32_t input_len)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  uint8_t tmp_twoblocks [128];
  
  __n = (ulong)(input_len & 0x3f);
  Hacl_Hash_MD5_update_multi(s,input,input_len >> 6);
  tmp_twoblocks[0x70] = '\0';
  tmp_twoblocks[0x71] = '\0';
  tmp_twoblocks[0x72] = '\0';
  tmp_twoblocks[0x73] = '\0';
  tmp_twoblocks[0x74] = '\0';
  tmp_twoblocks[0x75] = '\0';
  tmp_twoblocks[0x76] = '\0';
  tmp_twoblocks[0x77] = '\0';
  tmp_twoblocks[0x78] = '\0';
  tmp_twoblocks[0x79] = '\0';
  tmp_twoblocks[0x7a] = '\0';
  tmp_twoblocks[0x7b] = '\0';
  tmp_twoblocks[0x7c] = '\0';
  tmp_twoblocks[0x7d] = '\0';
  tmp_twoblocks[0x7e] = '\0';
  tmp_twoblocks[0x7f] = '\0';
  tmp_twoblocks[0x60] = '\0';
  tmp_twoblocks[0x61] = '\0';
  tmp_twoblocks[0x62] = '\0';
  tmp_twoblocks[99] = '\0';
  tmp_twoblocks[100] = '\0';
  tmp_twoblocks[0x65] = '\0';
  tmp_twoblocks[0x66] = '\0';
  tmp_twoblocks[0x67] = '\0';
  tmp_twoblocks[0x68] = '\0';
  tmp_twoblocks[0x69] = '\0';
  tmp_twoblocks[0x6a] = '\0';
  tmp_twoblocks[0x6b] = '\0';
  tmp_twoblocks[0x6c] = '\0';
  tmp_twoblocks[0x6d] = '\0';
  tmp_twoblocks[0x6e] = '\0';
  tmp_twoblocks[0x6f] = '\0';
  tmp_twoblocks[0x50] = '\0';
  tmp_twoblocks[0x51] = '\0';
  tmp_twoblocks[0x52] = '\0';
  tmp_twoblocks[0x53] = '\0';
  tmp_twoblocks[0x54] = '\0';
  tmp_twoblocks[0x55] = '\0';
  tmp_twoblocks[0x56] = '\0';
  tmp_twoblocks[0x57] = '\0';
  tmp_twoblocks[0x58] = '\0';
  tmp_twoblocks[0x59] = '\0';
  tmp_twoblocks[0x5a] = '\0';
  tmp_twoblocks[0x5b] = '\0';
  tmp_twoblocks[0x5c] = '\0';
  tmp_twoblocks[0x5d] = '\0';
  tmp_twoblocks[0x5e] = '\0';
  tmp_twoblocks[0x5f] = '\0';
  tmp_twoblocks[0x40] = '\0';
  tmp_twoblocks[0x41] = '\0';
  tmp_twoblocks[0x42] = '\0';
  tmp_twoblocks[0x43] = '\0';
  tmp_twoblocks[0x44] = '\0';
  tmp_twoblocks[0x45] = '\0';
  tmp_twoblocks[0x46] = '\0';
  tmp_twoblocks[0x47] = '\0';
  tmp_twoblocks[0x48] = '\0';
  tmp_twoblocks[0x49] = '\0';
  tmp_twoblocks[0x4a] = '\0';
  tmp_twoblocks[0x4b] = '\0';
  tmp_twoblocks[0x4c] = '\0';
  tmp_twoblocks[0x4d] = '\0';
  tmp_twoblocks[0x4e] = '\0';
  tmp_twoblocks[0x4f] = '\0';
  tmp_twoblocks[0x30] = '\0';
  tmp_twoblocks[0x31] = '\0';
  tmp_twoblocks[0x32] = '\0';
  tmp_twoblocks[0x33] = '\0';
  tmp_twoblocks[0x34] = '\0';
  tmp_twoblocks[0x35] = '\0';
  tmp_twoblocks[0x36] = '\0';
  tmp_twoblocks[0x37] = '\0';
  tmp_twoblocks[0x38] = '\0';
  tmp_twoblocks[0x39] = '\0';
  tmp_twoblocks[0x3a] = '\0';
  tmp_twoblocks[0x3b] = '\0';
  tmp_twoblocks[0x3c] = '\0';
  tmp_twoblocks[0x3d] = '\0';
  tmp_twoblocks[0x3e] = '\0';
  tmp_twoblocks[0x3f] = '\0';
  tmp_twoblocks[0x20] = '\0';
  tmp_twoblocks[0x21] = '\0';
  tmp_twoblocks[0x22] = '\0';
  tmp_twoblocks[0x23] = '\0';
  tmp_twoblocks[0x24] = '\0';
  tmp_twoblocks[0x25] = '\0';
  tmp_twoblocks[0x26] = '\0';
  tmp_twoblocks[0x27] = '\0';
  tmp_twoblocks[0x28] = '\0';
  tmp_twoblocks[0x29] = '\0';
  tmp_twoblocks[0x2a] = '\0';
  tmp_twoblocks[0x2b] = '\0';
  tmp_twoblocks[0x2c] = '\0';
  tmp_twoblocks[0x2d] = '\0';
  tmp_twoblocks[0x2e] = '\0';
  tmp_twoblocks[0x2f] = '\0';
  tmp_twoblocks[0x10] = '\0';
  tmp_twoblocks[0x11] = '\0';
  tmp_twoblocks[0x12] = '\0';
  tmp_twoblocks[0x13] = '\0';
  tmp_twoblocks[0x14] = '\0';
  tmp_twoblocks[0x15] = '\0';
  tmp_twoblocks[0x16] = '\0';
  tmp_twoblocks[0x17] = '\0';
  tmp_twoblocks[0x18] = '\0';
  tmp_twoblocks[0x19] = '\0';
  tmp_twoblocks[0x1a] = '\0';
  tmp_twoblocks[0x1b] = '\0';
  tmp_twoblocks[0x1c] = '\0';
  tmp_twoblocks[0x1d] = '\0';
  tmp_twoblocks[0x1e] = '\0';
  tmp_twoblocks[0x1f] = '\0';
  tmp_twoblocks[0] = '\0';
  tmp_twoblocks[1] = '\0';
  tmp_twoblocks[2] = '\0';
  tmp_twoblocks[3] = '\0';
  tmp_twoblocks[4] = '\0';
  tmp_twoblocks[5] = '\0';
  tmp_twoblocks[6] = '\0';
  tmp_twoblocks[7] = '\0';
  tmp_twoblocks[8] = '\0';
  tmp_twoblocks[9] = '\0';
  tmp_twoblocks[10] = '\0';
  tmp_twoblocks[0xb] = '\0';
  tmp_twoblocks[0xc] = '\0';
  tmp_twoblocks[0xd] = '\0';
  tmp_twoblocks[0xe] = '\0';
  tmp_twoblocks[0xf] = '\0';
  memcpy(tmp_twoblocks,input + (input_len & 0xffffffc0),__n);
  tmp_twoblocks[__n] = 0x80;
  iVar3 = (int)(prev_len + input_len);
  uVar1 = (ulong)(0x37U - iVar3 & 0x3f);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    tmp_twoblocks[uVar2 + __n + 1] = '\0';
  }
  *(uint64_t *)(tmp_twoblocks + uVar1 + __n + 1) = (prev_len + input_len) * 8;
  Hacl_Hash_MD5_update_multi(s,tmp_twoblocks,(0x37U - iVar3 & 0x3f) + (input_len & 0x3f) + 9 >> 6);
  return;
}

Assistant:

void
Hacl_Hash_MD5_update_last(uint32_t *s, uint64_t prev_len, uint8_t *input, uint32_t input_len)
{
  uint32_t blocks_n = input_len / 64U;
  uint32_t blocks_len = blocks_n * 64U;
  uint8_t *blocks = input;
  uint32_t rest_len = input_len - blocks_len;
  uint8_t *rest = input + blocks_len;
  Hacl_Hash_MD5_update_multi(s, blocks, blocks_n);
  uint64_t total_input_len = prev_len + (uint64_t)input_len;
  uint32_t pad_len = 1U + (128U - (9U + (uint32_t)(total_input_len % (uint64_t)64U))) % 64U + 8U;
  uint32_t tmp_len = rest_len + pad_len;
  uint8_t tmp_twoblocks[128U] = { 0U };
  uint8_t *tmp = tmp_twoblocks;
  uint8_t *tmp_rest = tmp;
  uint8_t *tmp_pad = tmp + rest_len;
  memcpy(tmp_rest, rest, rest_len * sizeof (uint8_t));
  pad(total_input_len, tmp_pad);
  Hacl_Hash_MD5_update_multi(s, tmp, tmp_len / 64U);
}